

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O0

StringTree * __thiscall
kj::strTree<int,char_const(&)[2],unsigned_int,char_const(&)[2],long,char_const(&)[2],long_long>
          (StringTree *__return_storage_ptr__,kj *this,int *params,char (*params_1) [2],
          uint *params_2,char (*params_3) [2],long *params_4,char (*params_5) [2],longlong *params_6
          )

{
  int *value;
  char (*pacVar1) [2];
  uint *value_00;
  long *value_01;
  longlong *value_02;
  StringTree *__return_storage_ptr___00;
  CappedArray<char,_26UL> local_e8;
  ArrayPtr<const_char> local_c0;
  CappedArray<char,_26UL> local_b0;
  ArrayPtr<const_char> local_88;
  CappedArray<char,_14UL> local_78;
  ArrayPtr<const_char> local_60;
  ArrayDisposer *local_38;
  long *params_local_4;
  char (*params_local_3) [2];
  uint *params_local_2;
  char (*params_local_1) [2];
  int *params_local;
  
  __return_storage_ptr___00 = __return_storage_ptr__;
  local_38 = (ArrayDisposer *)params_3;
  params_local_4 = (long *)params_2;
  params_local_3 = params_1;
  params_local_2 = (uint *)params;
  params_local_1 = (char (*) [2])this;
  params_local = (int *)__return_storage_ptr__;
  value = fwd<int>((NoInfer<int> *)this);
  _::toStringTreeOrCharSequence<int>((CappedArray<char,_14UL> *)&stack0xffffffffffffffb0,value);
  pacVar1 = ::const((char (*) [2])params_local_2);
  local_60 = _::toStringTreeOrCharSequence<char_const(&)[2]>(pacVar1);
  value_00 = fwd<unsigned_int>((NoInfer<unsigned_int> *)params_local_3);
  _::toStringTreeOrCharSequence<unsigned_int>(&local_78,value_00);
  pacVar1 = ::const((char (*) [2])params_local_4);
  local_88 = _::toStringTreeOrCharSequence<char_const(&)[2]>(pacVar1);
  value_01 = fwd<long>((NoInfer<long> *)local_38);
  _::toStringTreeOrCharSequence<long>(&local_b0,value_01);
  pacVar1 = ::const((char (*) [2])params_4);
  local_c0 = _::toStringTreeOrCharSequence<char_const(&)[2]>(pacVar1);
  value_02 = fwd<long_long>((NoInfer<long_long> *)params_5);
  _::toStringTreeOrCharSequence<long_long>(&local_e8,value_02);
  StringTree::
  concat<kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::CappedArray<char,26ul>,kj::ArrayPtr<char_const>,kj::CappedArray<char,26ul>>
            (__return_storage_ptr___00,(StringTree *)&stack0xffffffffffffffb0,
             (CappedArray<char,_14UL> *)&local_60,(ArrayPtr<const_char> *)&local_78,
             (CappedArray<char,_14UL> *)&local_88,(ArrayPtr<const_char> *)&local_b0,
             (CappedArray<char,_26UL> *)&local_c0,(ArrayPtr<const_char> *)&local_e8,
             (CappedArray<char,_26UL> *)__return_storage_ptr___00);
  return __return_storage_ptr__;
}

Assistant:

StringTree strTree(Params&&... params) {
  return StringTree::concat(_::toStringTreeOrCharSequence(kj::fwd<Params>(params))...);
}